

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O3

void fstk_RunInclude(char *path)

{
  Context *pCVar1;
  bool bVar2;
  FileStackNode *fileInfo;
  LexerState *pLVar3;
  int *piVar4;
  char *pcVar5;
  char *fullPath;
  size_t size;
  char *local_28;
  size_t local_20;
  
  local_28 = (char *)0x0;
  local_20 = 0;
  bVar2 = fstk_FindFile(path,&local_28,&local_20);
  if (bVar2) {
    fileInfo = (FileStackNode *)malloc(local_20 + 0x28);
    pcVar5 = local_28;
    if (fileInfo == (FileStackNode *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Failed to alloc file info for INCLUDE: %s\n",pcVar5);
      return;
    }
    fileInfo->type = NODE_FILE;
    strcpy((char *)(fileInfo + 1),local_28);
    free(pcVar5);
    newContext(fileInfo);
    pLVar3 = lexer_OpenFile((char *)(fileInfo + 1));
    pCVar1 = contextStack;
    contextStack->lexerState = pLVar3;
    if (pLVar3 == (LexerState *)0x0) {
      fatalerror("Failed to set up lexer for file include\n");
    }
    lexerStateEOL = pLVar3;
    pCVar1->uniqueID = pCVar1->parent->uniqueID;
  }
  else {
    free(local_28);
    if (generatedMissingIncludes != true) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Unable to open included file \'%s\': %s\n",path,pcVar5);
      return;
    }
    if (verbose == true) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("Aborting (-MG) on INCLUDE file \'%s\' (%s)\n",path,pcVar5);
    }
    failedOnMissingInclude = true;
  }
  return;
}

Assistant:

void fstk_RunInclude(char const *path)
{
	char *fullPath = NULL;
	size_t size = 0;

	if (!fstk_FindFile(path, &fullPath, &size)) {
		free(fullPath);
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCLUDE file '%s' (%s)\n",
				       path, strerror(errno));
			failedOnMissingInclude = true;
		} else {
			error("Unable to open included file '%s': %s\n", path, strerror(errno));
		}
		return;
	}

	struct FileStackNamedNode *fileInfo =
		(struct FileStackNamedNode *)malloc(sizeof(*fileInfo) + size);

	if (!fileInfo) {
		error("Failed to alloc file info for INCLUDE: %s\n", strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_FILE;
	strcpy(fileInfo->name, fullPath);
	free(fullPath);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFile(fileInfo->name);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for file include\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	// We're back at top-level, so most things are reset,
	// but not the unique ID, since INCLUDE may be inside a
	// MACRO or REPT/FOR loop
	contextStack->uniqueID = contextStack->parent->uniqueID;
}